

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O1

int fits_read_fits_region(fitsfile *fptr,WCSdata *wcs,SAORegion **Rgn,int *status)

{
  anon_union_120_2_131c4ffb_for_param *array;
  double *pdVar1;
  shapeType sVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  SAORegion *pSVar6;
  RgnShape *pRVar7;
  int *piVar8;
  anon_union_120_2_131c4ffb_for_param *array_00;
  long lVar9;
  uint uVar10;
  undefined4 uVar11;
  ulong uVar12;
  char (*pacVar13) [71];
  char *__s2;
  anon_union_120_2_131c4ffb_for_param *paVar14;
  WCSdata *pWVar15;
  WCSdata *pWVar16;
  char *pcVar17;
  long *naxes;
  double *pdVar18;
  byte bVar19;
  double dVar20;
  double dVar21;
  int anynul;
  anon_union_120_2_131c4ffb_for_param *local_350;
  RgnShape *local_348;
  undefined4 local_33c;
  double *local_338;
  WCSdata *local_330;
  int *local_328;
  double *local_320;
  SAORegion *local_318;
  double local_310;
  double local_308;
  char *local_300;
  double *local_2f8;
  double *local_2f0;
  int icol [6];
  char *cvalue;
  double Ypos;
  double Xpos;
  int local_2b0;
  int tstatus;
  anon_union_120_2_131c4ffb_for_param *local_2a8;
  double Y;
  double X;
  ulong local_290;
  RgnShape *local_288;
  long local_280;
  SAORegion **local_278;
  int idum;
  long icsize [6];
  char comment [73];
  char colname [6] [71];
  
  bVar19 = 0;
  pacVar13 = colname;
  memcpy(pacVar13,&DAT_0021cdf0,0x1aa);
  if (*status != 0) {
    return *status;
  }
  local_278 = Rgn;
  pSVar6 = (SAORegion *)malloc(0x58);
  if (pSVar6 == (SAORegion *)0x0) {
    ffpmsg("Couldn\'t allocate memory to hold Region file contents.");
    *status = 0x71;
    return 0x71;
  }
  pSVar6->nShapes = 0;
  pSVar6->Shapes = (RgnShape *)0x0;
  if ((wcs == (WCSdata *)0x0) || (wcs->exists == 0)) {
    (pSVar6->wcs).exists = 0;
  }
  else {
    pWVar15 = wcs;
    pWVar16 = &pSVar6->wcs;
    for (lVar9 = 9; lVar9 != 0; lVar9 = lVar9 + -1) {
      uVar11 = *(undefined4 *)&pWVar15->field_0x4;
      pWVar16->exists = pWVar15->exists;
      *(undefined4 *)&pWVar16->field_0x4 = uVar11;
      pWVar15 = (WCSdata *)((long)pWVar15 + (ulong)bVar19 * -0x10 + 8);
      pWVar16 = (WCSdata *)((long)pWVar16 + (ulong)bVar19 * -0x10 + 8);
    }
  }
  tstatus = 0;
  lVar9 = 0;
  local_330 = wcs;
  do {
    ffgcno(fptr,0,*pacVar13,(int *)((long)icol + lVar9),&tstatus);
    lVar9 = lVar9 + 4;
    pacVar13 = pacVar13 + 1;
  } while (lVar9 != 0x14);
  if ((tstatus == 0) || (iVar5 = ffmnhd(fptr,2,"REGION",1,status), iVar5 == 0)) {
    iVar5 = ffgky(fptr,0x1f,"NAXIS2",pSVar6,comment,status);
    if (iVar5 == 0) {
      pRVar7 = (RgnShape *)malloc((long)pSVar6->nShapes * 0xa8);
      pSVar6->Shapes = pRVar7;
      if (pRVar7 == (RgnShape *)0x0) {
        pcVar17 = "Failed to allocate memory for Region data";
LAB_001fcdab:
        ffpmsg(pcVar17);
        *status = 0x71;
      }
      else {
        pacVar13 = colname;
        lVar9 = 0;
        do {
          iVar5 = ffgcno(fptr,0,*pacVar13,(int *)((long)icol + lVar9),status);
          if (iVar5 != 0) {
            pcVar17 = "Could not find column.";
            goto LAB_001fcb13;
          }
          lVar9 = lVar9 + 4;
          pacVar13 = pacVar13 + 1;
        } while (lVar9 != 0x14);
        local_2b0 = ffgcno(fptr,0,colname[5],icol + 5,status);
        local_33c = (undefined4)CONCAT71((uint7)(uint3)((uint)local_2b0 >> 8),1);
        if ((pSVar6->wcs).exists == 0) {
          local_328 = (int *)0x0;
        }
        else {
          piVar8 = (int *)malloc(0x48);
          if (piVar8 == (int *)0x0) {
            pcVar17 = "Failed to allocate memory for Region WCS data";
            goto LAB_001fcdab;
          }
          *piVar8 = 1;
          local_348 = (RgnShape *)(piVar8 + 2);
          local_338 = (double *)(piVar8 + 4);
          local_350 = (anon_union_120_2_131c4ffb_for_param *)(piVar8 + 6);
          local_2f0 = (double *)(piVar8 + 10);
          local_320 = (double *)(piVar8 + 0xc);
          local_2f8 = (double *)(piVar8 + 0xe);
          local_300 = (char *)(piVar8 + 0x10);
          iVar5 = ffgtcs(fptr,icol[0],icol[1],(double *)local_348,local_338,(double *)local_350,
                         (double *)(piVar8 + 8),local_2f0,local_320,local_2f8,local_300,status);
          if (iVar5 != 0) {
            *piVar8 = 0;
            *status = 0;
          }
          local_328 = piVar8;
          if (((*piVar8 != 0) && (local_330->exists != 0)) &&
             ((((1e-06 < ABS(*(double *)local_348 - local_330->xrefval) ||
                ((((1e-06 < ABS(*local_338 - local_330->yrefval) ||
                   (1e-06 < ABS((local_350->gen).p[0] - local_330->xrefpix))) ||
                  (1e-06 < ABS(*(double *)(piVar8 + 8) - local_330->yrefpix))) ||
                 ((1e-06 < ABS(*local_2f0 - local_330->xinc) ||
                  (1e-06 < ABS(*local_320 - local_330->yinc))))))) ||
               (1e-06 < ABS(*local_2f8 - local_330->rot))) ||
              (iVar5 = strcmp(local_300,local_330->type), iVar5 == 0)))) {
            local_33c = 0;
          }
        }
        naxes = icsize;
        lVar9 = 0;
        do {
          iVar5 = ffgtdm(fptr,icol[lVar9],1,&idum,naxes,status);
          if (iVar5 != 0) {
            pcVar17 = "Could not find vector size of column.";
            goto LAB_001fcb13;
          }
          lVar9 = lVar9 + 1;
          naxes = naxes + 1;
        } while (lVar9 != 6);
        cvalue = (char *)malloc(0x48);
        if (0 < pSVar6->nShapes) {
          local_2f8 = (double *)(local_328 + 0x10);
          local_300 = local_330->type;
          pdVar18 = (double *)0x1;
          local_310 = 0.0;
          local_308 = 0.0;
          local_318 = pSVar6;
          do {
            pRVar7 = pSVar6->Shapes;
            pdVar1 = pRVar7[(long)pdVar18 + -1].param.gen.p + 6;
            *pdVar1 = 0.0;
            pdVar1[1] = 0.0;
            pdVar1 = pRVar7[(long)pdVar18 + -1].param.gen.p + 4;
            *pdVar1 = 0.0;
            pdVar1[1] = 0.0;
            pdVar1 = pRVar7[(long)pdVar18 + -1].param.gen.p + 2;
            *pdVar1 = 0.0;
            pdVar1[1] = 0.0;
            pRVar7[(long)pdVar18 + -1].param.gen.p[0] = 0.0;
            *(undefined8 *)((long)&pRVar7[(long)pdVar18 + -1].param + 8) = 0;
            pdVar1 = &pRVar7[(long)pdVar18 + -1].param.gen.sinT;
            *pdVar1 = 0.0;
            pdVar1[1] = 0.0;
            pdVar1 = &pRVar7[(long)pdVar18 + -1].param.gen.a;
            *pdVar1 = 0.0;
            pdVar1[1] = 0.0;
            iVar5 = ffgcvs(fptr,icol[2],(LONGLONG)pdVar18,1,1," ",&cvalue,&anynul,status);
            if (iVar5 != 0) {
              pcVar17 = "Could not read shape.";
              goto LAB_001fcb13;
            }
            local_288 = pRVar7 + (long)pdVar18 + -1;
            local_288->sign = '\x01';
            pcVar17 = cvalue;
            if (*cvalue == '!') {
              local_288->sign = '\0';
              pcVar17 = cvalue + 1;
            }
            local_348 = pRVar7 + (long)pdVar18;
            local_2a8 = &pRVar7[(long)pdVar18 + -1].param;
            __s2 = "POINT";
            lVar9 = 0;
            local_338 = pdVar18;
            do {
              iVar5 = strcmp(pcVar17,__s2);
              paVar14 = local_2a8;
              pRVar7 = local_348;
              if (iVar5 == 0) {
                local_348[-1].shape = *(shapeType *)((long)&DAT_0021d460 + lVar9);
              }
              lVar9 = lVar9 + 4;
              __s2 = __s2 + 0x47;
            } while (lVar9 != 0x44);
            array_00 = local_2a8;
            if (local_348[-1].shape == poly_rgn) {
              array_00 = (anon_union_120_2_131c4ffb_for_param *)
                         calloc(CONCAT44(icsize[0]._4_4_,(int)icsize[0]) * 2,8);
              pRVar7[-1].param.poly.Pts = (double *)array_00;
              if (array_00 == (anon_union_120_2_131c4ffb_for_param *)0x0) {
                pcVar17 = "Could not allocate memory to hold polygon parameters";
                goto LAB_001fcdab;
              }
              (paVar14->poly).nPts = (int)icsize[0] * 2;
            }
            uVar10 = 1;
            if (pRVar7[-1].shape == poly_rgn) {
              uVar10 = (paVar14->poly).nPts / 2;
            }
            if (pRVar7[-1].shape == rectangle_rgn) {
              uVar10 = 2;
            }
            uVar12 = (ulong)uVar10;
            if (0 < (int)uVar10) {
              local_280 = uVar12 << 4;
              lVar9 = 0;
              pdVar18 = (double *)0x0;
              paVar14 = array_00;
              local_350 = array_00;
              local_290 = uVar12;
              do {
                array = (anon_union_120_2_131c4ffb_for_param *)((long)local_350 + lVar9);
                local_2f0 = (double *)((long)pdVar18 + 1);
                local_320 = pdVar18;
                iVar5 = ffgcvd(fptr,icol[0],(LONGLONG)local_338,(LONGLONG)local_2f0,1,
                               -9.1191291391491e-36,(double *)array,&anynul,status);
                if (iVar5 != 0) {
                  pcVar17 = "Failed to read X column for polygon region";
                  goto LAB_001fcb13;
                }
                if (((array->gen).p[0] == -9.1191291391491e-36) &&
                   (pdVar18 = local_320, array_00 = array, !NAN((array->gen).p[0]))) {
LAB_001fd172:
                  (local_2a8->poly).nPts = (int)pdVar18 * 2;
                  uVar12 = (ulong)pdVar18 & 0xffffffff;
                  pRVar7 = local_348;
                  goto LAB_001fd189;
                }
                pdVar18 = (double *)((long)local_350 + lVar9 + 8);
                iVar5 = ffgcvd(fptr,icol[1],(LONGLONG)local_338,(LONGLONG)local_2f0,1,
                               -9.1191291391491e-36,pdVar18,&anynul,status);
                if (iVar5 != 0) {
                  ffpmsg("Failed to read Y column for polygon region");
                  pSVar6 = local_318;
                  goto LAB_001fcb18;
                }
                dVar20 = *pdVar18;
                pSVar6 = local_318;
                if ((dVar20 == -9.1191291391491e-36) &&
                   (pdVar18 = local_320, array_00 = paVar14, !NAN(dVar20))) goto LAB_001fd172;
                array_00 = (anon_union_120_2_131c4ffb_for_param *)((long)paVar14 + 0x10);
                dVar21 = (array->gen).p[0];
                dVar3 = dVar20;
                dVar4 = dVar21;
                if (lVar9 != 0) {
                  dVar3 = local_310;
                  dVar4 = local_308;
                  if ((local_308 == dVar21) && (!NAN(local_308) && !NAN(dVar21))) {
                    if ((local_310 == dVar20) &&
                       (pdVar18 = local_2f0, !NAN(local_310) && !NAN(dVar20))) goto LAB_001fd172;
                  }
                }
                local_308 = dVar4;
                local_310 = dVar3;
                lVar9 = lVar9 + 0x10;
                pdVar18 = (double *)((long)local_320 + 1);
                paVar14 = array_00;
              } while (local_280 != lVar9);
              array_00 = (anon_union_120_2_131c4ffb_for_param *)((long)local_350 + lVar9);
              uVar12 = local_290;
              pRVar7 = local_348;
            }
LAB_001fd189:
            if ((char)local_33c == '\0') {
              pdVar18 = (double *)((long)array_00 + (long)((int)uVar12 * 2) * -8);
              local_308 = *pdVar18;
              local_310 = pdVar18[1];
              if (0 < (int)uVar12) {
                uVar12 = uVar12 & 0xffffffff;
                pdVar18 = pdVar18 + 1;
                local_350 = array_00;
                do {
                  ffwldp(pdVar18[-1],*pdVar18,*(double *)(local_328 + 2),*(double *)(local_328 + 4),
                         *(double *)(local_328 + 6),*(double *)(local_328 + 8),
                         *(double *)(local_328 + 10),*(double *)(local_328 + 0xc),
                         *(double *)(local_328 + 0xe),(char *)local_2f8,&Xpos,&Ypos,status);
                  ffxypx(Xpos,Ypos,local_330->xrefval,local_330->yrefval,local_330->xrefpix,
                         local_330->yrefpix,local_330->xinc,local_330->yinc,local_330->rot,local_300
                         ,pdVar18 + -1,pdVar18,status);
                  if (*status != 0) goto LAB_001fd637;
                  pdVar18 = pdVar18 + 2;
                  uVar12 = uVar12 - 1;
                  array_00 = local_350;
                  pRVar7 = local_348;
                } while (uVar12 != 0);
              }
            }
            sVar2 = pRVar7[-1].shape;
            uVar11 = 0;
            if (sVar2 < poly_rgn) {
              if ((0x658U >> (sVar2 & 0x1f) & 1) == 0) {
                if ((0xa0U >> (sVar2 & 0x1f) & 1) == 0) {
                  uVar10 = 0;
                  if (sVar2 != circle_rgn) goto LAB_001fd2f0;
                  uVar10 = 1;
                }
                else {
                  uVar10 = 4;
                }
              }
              else {
                uVar10 = 2;
              }
              uVar11 = 1;
            }
            else {
              uVar10 = 0;
            }
LAB_001fd2f0:
            pWVar15 = local_330;
            if ((char)uVar11 != '\0') {
              local_350 = (anon_union_120_2_131c4ffb_for_param *)CONCAT44(local_350._4_4_,uVar11);
              iVar5 = ffgcvd(fptr,icol[3],(LONGLONG)local_338,1,(ulong)uVar10,0.0,(double *)array_00
                             ,&anynul,status);
              pWVar15 = local_330;
              if (iVar5 != 0) {
                pcVar17 = "Failed to read R column for region";
                goto LAB_001fcb13;
              }
              if ((char)local_33c == '\0') {
                if ((char)local_350 != '\0') {
                  iVar5 = uVar10 + (uVar10 == 0);
                  do {
                    Y = (array_00->gen).p[0] + local_310;
                    X = local_308;
                    ffwldp(local_308,Y,*(double *)(local_328 + 2),*(double *)(local_328 + 4),
                           *(double *)(local_328 + 6),*(double *)(local_328 + 8),
                           *(double *)(local_328 + 10),*(double *)(local_328 + 0xc),
                           *(double *)(local_328 + 0xe),(char *)local_2f8,&Xpos,&Ypos,status);
                    ffxypx(Xpos,Ypos,pWVar15->xrefval,pWVar15->yrefval,pWVar15->xrefpix,
                           pWVar15->yrefpix,pWVar15->xinc,pWVar15->yinc,pWVar15->rot,local_300,&X,&Y
                           ,status);
                    if (*status != 0) goto LAB_001fd637;
                    dVar21 = X - local_348[-1].param.gen.p[0];
                    dVar20 = Y - local_348[-1].param.gen.p[1];
                    dVar20 = dVar20 * dVar20 + dVar21 * dVar21;
                    if (dVar20 < 0.0) {
                      dVar20 = sqrt(dVar20);
                    }
                    else {
                      dVar20 = SQRT(dVar20);
                    }
                    (array_00->gen).p[0] = dVar20;
                    array_00 = (anon_union_120_2_131c4ffb_for_param *)((long)array_00 + 8);
                    iVar5 = iVar5 + -1;
                  } while (iVar5 != 0);
                }
              }
              else {
                array_00 = (anon_union_120_2_131c4ffb_for_param *)
                           ((long)array_00 + (ulong)uVar10 * 8);
              }
            }
            sVar2 = local_348[-1].shape;
            uVar11 = 0;
            if (sVar2 < poly_rgn) {
              if ((0x250U >> (sVar2 & 0x1f) & 1) == 0) {
                uVar10 = 0;
                if ((0x4a0U >> (sVar2 & 0x1f) & 1) == 0) goto LAB_001fd4e6;
                uVar10 = 2;
              }
              else {
                uVar10 = 1;
              }
              uVar11 = 1;
            }
            else {
              uVar10 = 0;
            }
LAB_001fd4e6:
            if ((char)uVar11 != '\0') {
              local_350 = (anon_union_120_2_131c4ffb_for_param *)CONCAT44(local_350._4_4_,uVar11);
              iVar5 = ffgcvd(fptr,icol[4],(LONGLONG)local_338,1,(ulong)uVar10,0.0,(double *)array_00
                             ,&anynul,status);
              if (iVar5 != 0) {
                pcVar17 = "Failed to read ROTANG column for region";
                goto LAB_001fcb13;
              }
              if (((char)local_33c == '\0') && ((char)local_350 != '\0')) {
                dVar20 = pWVar15->rot;
                dVar21 = *(double *)(local_328 + 0xe);
                lVar9 = 0;
                do {
                  *(double *)((long)array_00 + lVar9 * 8) =
                       *(double *)((long)array_00 + lVar9 * 8) + (dVar20 - dVar21);
                  lVar9 = lVar9 + 1;
                } while (uVar10 + ((ulong)uVar10 == 0) != (int)lVar9);
              }
            }
            pdVar1 = local_338;
            if (local_2b0 == 0) {
              iVar5 = ffgcv(fptr,0x1f,icol[5],(LONGLONG)local_338,1,1,(void *)0x0,
                            &local_348[-1].comp,&anynul,status);
              if (iVar5 != 0) {
                pcVar17 = "Failed to read COMPONENT column for region";
                goto LAB_001fcb13;
              }
            }
            else {
              local_348[-1].comp = 1;
            }
            fits_setup_shape(local_288);
            pdVar18 = (double *)((long)pdVar1 + 1);
          } while ((long)pdVar1 < (long)pSVar6->nShapes);
        }
      }
      goto LAB_001fcb18;
    }
    pcVar17 = "Could not read NAXIS2 keyword.";
  }
  else {
    pcVar17 = "Could not move to REGION extension.";
  }
LAB_001fcb13:
  ffpmsg(pcVar17);
LAB_001fcb18:
  if (*status == 0) {
    *local_278 = pSVar6;
  }
  else {
    fits_free_region(pSVar6);
  }
  ffclos(fptr,status);
  return *status;
LAB_001fd637:
  pcVar17 = "Failed to transform coordinates";
  goto LAB_001fcb13;
}

Assistant:

int fits_read_fits_region ( fitsfile *fptr, 
			    WCSdata *wcs, 
			    SAORegion **Rgn, 
			    int *status)
/*  Read regions from a FITS region extension and return the information     */
/*  in the "SAORegion" structure.  If it is nonNULL, use wcs to convert the  */
/*  region coordinates to pixels.  Return an error if region is in degrees   */
/*  but no WCS data is provided.                                             */
/*---------------------------------------------------------------------------*/
{

  int i, j, icol[6], idum, anynul, npos;
  int dotransform, got_component = 1, tstatus;
  long icsize[6];
  double X, Y, Theta, Xsave = 0, Ysave = 0, Xpos, Ypos;
  double *coords;
  char *cvalue, *cvalue2;
  char comment[FLEN_COMMENT];
  char colname[6][FLEN_VALUE] = {"X", "Y", "SHAPE", "R", "ROTANG", "COMPONENT"};
  char shapename[17][FLEN_VALUE] = {"POINT","CIRCLE","ELLIPSE","ANNULUS",
				    "ELLIPTANNULUS","BOX","ROTBOX","BOXANNULUS",
				    "RECTANGLE","ROTRECTANGLE","POLYGON","PIE",
				    "SECTOR","DIAMOND","RHOMBUS","ROTDIAMOND",
				    "ROTRHOMBUS"};
  int shapetype[17] = {point_rgn, circle_rgn, ellipse_rgn, annulus_rgn, 
		       elliptannulus_rgn, box_rgn, box_rgn, boxannulus_rgn, 
		       rectangle_rgn, rectangle_rgn, poly_rgn, sector_rgn, 
		       sector_rgn, diamond_rgn, diamond_rgn, diamond_rgn, 
		       diamond_rgn};
  SAORegion *aRgn;
  RgnShape *newShape;
  WCSdata *regwcs = 0;

  if ( *status ) return( *status );

  aRgn = (SAORegion *)malloc( sizeof(SAORegion) );
  if( ! aRgn ) {
    ffpmsg("Couldn't allocate memory to hold Region file contents.");
    return(*status = MEMORY_ALLOCATION );
  }
  aRgn->nShapes    =    0;
  aRgn->Shapes     = NULL;
  if( wcs && wcs->exists )
    aRgn->wcs = *wcs;
  else
    aRgn->wcs.exists = 0;

  /* See if we are already positioned to a region extension, else */
  /* move to the REGION extension (file is already open). */

  tstatus = 0;
  for (i=0; i<5; i++) {
    ffgcno(fptr, CASEINSEN, colname[i], &icol[i], &tstatus);
  }

  if (tstatus) {
    /* couldn't find the required columns, so search for "REGION" extension */
    if ( ffmnhd(fptr, BINARY_TBL, "REGION", 1, status) ) {
      ffpmsg("Could not move to REGION extension.");
      goto error;
    }
  }

  /* get the number of shapes and allocate memory */

  if ( ffgky(fptr, TINT, "NAXIS2", &aRgn->nShapes, comment, status) ) {
    ffpmsg("Could not read NAXIS2 keyword.");
    goto error;
  }

  aRgn->Shapes = (RgnShape *) malloc(aRgn->nShapes * sizeof(RgnShape));
  if ( !aRgn->Shapes ) {
    ffpmsg( "Failed to allocate memory for Region data");
    *status = MEMORY_ALLOCATION;
    goto error;
  }

  /* get the required column numbers */

  for (i=0; i<5; i++) {
    if ( ffgcno(fptr, CASEINSEN, colname[i], &icol[i], status) ) {
      ffpmsg("Could not find column.");
      goto error;
    }
  }

  /* try to get the optional column numbers */

  if ( ffgcno(fptr, CASEINSEN, colname[5], &icol[5], status) ) {
       got_component = 0;
  }

  /* if there was input WCS then read the WCS info for the region in case they */
  /* are different and we have to transform */

  dotransform = 0;
  if ( aRgn->wcs.exists ) {
    regwcs = (WCSdata *) malloc ( sizeof(WCSdata) );
    if ( !regwcs ) {
      ffpmsg( "Failed to allocate memory for Region WCS data");
      *status = MEMORY_ALLOCATION;
      goto error;
    }

    regwcs->exists = 1;
    if ( ffgtcs(fptr, icol[0], icol[1], &regwcs->xrefval,  &regwcs->yrefval,
		&regwcs->xrefpix, &regwcs->yrefpix, &regwcs->xinc, &regwcs->yinc,
		&regwcs->rot, regwcs->type, status) ) {
      regwcs->exists = 0;
      *status = 0;
    }

    if ( regwcs->exists && wcs->exists ) {
      if ( fabs(regwcs->xrefval-wcs->xrefval) > 1.0e-6 ||
	   fabs(regwcs->yrefval-wcs->yrefval) > 1.0e-6 ||
	   fabs(regwcs->xrefpix-wcs->xrefpix) > 1.0e-6 ||
	   fabs(regwcs->yrefpix-wcs->yrefpix) > 1.0e-6 ||
	   fabs(regwcs->xinc-wcs->xinc) > 1.0e-6 ||
	   fabs(regwcs->yinc-wcs->yinc) > 1.0e-6 ||
	   fabs(regwcs->rot-wcs->rot) > 1.0e-6 ||
	   !strcmp(regwcs->type,wcs->type) ) dotransform = 1;
    }
  }

  /* get the sizes of the X, Y, R, and ROTANG vectors */

  for (i=0; i<6; i++) {
    if ( ffgtdm(fptr, icol[i], 1, &idum, &icsize[i], status) ) {
      ffpmsg("Could not find vector size of column.");
      goto error;
    }
  }

  cvalue = (char *) malloc ((FLEN_VALUE+1)*sizeof(char));

  /* loop over the shapes - note 1-based counting for rows in FITS files */

  for (i=1; i<=aRgn->nShapes; i++) {

    newShape = &aRgn->Shapes[i-1];
    for (j=0; j<8; j++) newShape->param.gen.p[j] = 0.0;
    newShape->param.gen.a = 0.0;
    newShape->param.gen.b = 0.0;
    newShape->param.gen.sinT = 0.0;
    newShape->param.gen.cosT = 0.0;

    /* get the shape */

    if ( ffgcvs(fptr, icol[2], i, 1, 1, " ", &cvalue, &anynul, status) ) {
      ffpmsg("Could not read shape.");
      goto error;
    }

    /* set include or exclude */

    newShape->sign = 1;
    cvalue2 = cvalue;
    if ( !strncmp(cvalue,"!",1) ) {
      newShape->sign = 0;
      cvalue2++;
    }

    /* set the shape type */

    for (j=0; j<17; j++) {
      if ( !strcmp(cvalue2, shapename[j]) ) newShape->shape = shapetype[j];
    }

    /* allocate memory for polygon case and set coords pointer */

    if ( newShape->shape == poly_rgn ) {
      newShape->param.poly.Pts = (double *) calloc (2*icsize[0], sizeof(double));
      if ( !newShape->param.poly.Pts ) {
	ffpmsg("Could not allocate memory to hold polygon parameters" );
	*status = MEMORY_ALLOCATION;
	goto error;
      }
      newShape->param.poly.nPts = 2*icsize[0];
      coords = newShape->param.poly.Pts;
    } else {
      coords = newShape->param.gen.p;
    }


  /* read X and Y. Polygon and Rectangle require special cases */

    npos = 1;
    if ( newShape->shape == poly_rgn ) npos = newShape->param.poly.nPts/2;
    if ( newShape->shape == rectangle_rgn ) npos = 2;

    for (j=0; j<npos; j++) {
      if ( ffgcvd(fptr, icol[0], i, j+1, 1, DOUBLENULLVALUE, coords, &anynul, status) ) {
	ffpmsg("Failed to read X column for polygon region");
	goto error;
      }
      if (*coords == DOUBLENULLVALUE) {  /* check for null value end of array marker */
        npos = j;
	newShape->param.poly.nPts = npos * 2;
	break;
      }
      coords++;
      
      if ( ffgcvd(fptr, icol[1], i, j+1, 1, DOUBLENULLVALUE, coords, &anynul, status) ) {
	ffpmsg("Failed to read Y column for polygon region");
	goto error;
      }
      if (*coords == DOUBLENULLVALUE) { /* check for null value end of array marker */
        npos = j;
	newShape->param.poly.nPts = npos * 2;
        coords--;
	break;
      }
      coords++;
 
      if (j == 0) {  /* save the first X and Y coordinate */
        Xsave = *(coords - 2);
	Ysave = *(coords - 1);
      } else if ((Xsave == *(coords - 2)) && (Ysave == *(coords - 1)) ) {
        /* if point has same coordinate as first point, this marks the end of the array */
        npos = j + 1;
	newShape->param.poly.nPts = npos * 2;
	break;
      }
    }

    /* transform positions if the region and input wcs differ */

    if ( dotransform ) {

      coords -= npos*2;
      Xsave = coords[0];
      Ysave = coords[1];
      for (j=0; j<npos; j++) {
	ffwldp(coords[2*j], coords[2*j+1], regwcs->xrefval, regwcs->yrefval, regwcs->xrefpix,
	       regwcs->yrefpix, regwcs->xinc, regwcs->yinc, regwcs->rot,
	       regwcs->type, &Xpos, &Ypos, status);
	ffxypx(Xpos, Ypos, wcs->xrefval, wcs->yrefval, wcs->xrefpix,
	       wcs->yrefpix, wcs->xinc, wcs->yinc, wcs->rot,
	       wcs->type, &coords[2*j], &coords[2*j+1], status);
	if ( *status ) {
	  ffpmsg("Failed to transform coordinates");
	  goto error;
	}
      }
      coords += npos*2;
    }

  /* read R. Circle requires one number; Box, Diamond, Ellipse, Annulus, Sector 
     and Panda two; Boxannulus and Elliptannulus four; Point, Rectangle and 
     Polygon none. */

    npos = 0;
    switch ( newShape->shape ) {
    case circle_rgn: 
      npos = 1;
      break;
    case box_rgn:
    case diamond_rgn:
    case ellipse_rgn:
    case annulus_rgn:
    case sector_rgn:
      npos = 2;
      break;
    case boxannulus_rgn:
    case elliptannulus_rgn:
      npos = 4;
      break;
    default:
      break;
    }

    if ( npos > 0 ) {
      if ( ffgcvd(fptr, icol[3], i, 1, npos, 0.0, coords, &anynul, status) ) {
	ffpmsg("Failed to read R column for region");
	goto error;
      }

    /* transform lengths if the region and input wcs differ */

      if ( dotransform ) {
	for (j=0; j<npos; j++) {
	  Y = Ysave + (*coords);
	  X = Xsave;
	  ffwldp(X, Y, regwcs->xrefval, regwcs->yrefval, regwcs->xrefpix,
		 regwcs->yrefpix, regwcs->xinc, regwcs->yinc, regwcs->rot,
		 regwcs->type, &Xpos, &Ypos, status);
	  ffxypx(Xpos, Ypos, wcs->xrefval, wcs->yrefval, wcs->xrefpix,
		 wcs->yrefpix, wcs->xinc, wcs->yinc, wcs->rot,
		 wcs->type, &X, &Y, status);
	  if ( *status ) {
	    ffpmsg("Failed to transform coordinates");
	    goto error;
	  }
	  *(coords++) = sqrt(pow(X-newShape->param.gen.p[0],2)+pow(Y-newShape->param.gen.p[1],2));
	}
      } else {
	coords += npos;
      }
    }

  /* read ROTANG. Requires two values for Boxannulus, Elliptannulus, Sector, 
     Panda; one for Box, Diamond, Ellipse; and none for Circle, Point, Annulus, 
     Rectangle, Polygon */

    npos = 0;
    switch ( newShape->shape ) {
    case box_rgn:
    case diamond_rgn:
    case ellipse_rgn:
      npos = 1;
      break;
    case boxannulus_rgn:
    case elliptannulus_rgn:
    case sector_rgn:
      npos = 2;
      break;
    default:
     break;
    }

    if ( npos > 0 ) {
      if ( ffgcvd(fptr, icol[4], i, 1, npos, 0.0, coords, &anynul, status) ) {
	ffpmsg("Failed to read ROTANG column for region");
	goto error;
      }

    /* transform angles if the region and input wcs differ */

      if ( dotransform ) {
	Theta = (wcs->rot) - (regwcs->rot);
	for (j=0; j<npos; j++) *(coords++) += Theta;
      } else {
	coords += npos;
      }
    }

  /* read the component number */

    if (got_component) {
      if ( ffgcv(fptr, TINT, icol[5], i, 1, 1, 0, &newShape->comp, &anynul, status) ) {
        ffpmsg("Failed to read COMPONENT column for region");
        goto error;
      }
    } else {
      newShape->comp = 1;
    }


    /* do some precalculations to speed up tests */

    fits_setup_shape(newShape);

    /* end loop over shapes */

  }

error:

   if( *status )
      fits_free_region( aRgn );
   else
      *Rgn = aRgn;

   ffclos(fptr, status);

   return( *status );
}